

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O0

void __thiscall Arcflow::relabel_graph(Arcflow *this,vector<int,_std::allocator<int>_> *labels)

{
  bool bVar1;
  const_reference pvVar2;
  iterator __first;
  iterator __last;
  Arc local_7c;
  int local_70;
  int local_6c;
  int v;
  int u;
  Arc *a;
  iterator __end1;
  iterator __begin1;
  vector<Arc,_std::allocator<Arc>_> *__range1;
  set<Arc,_std::less<Arc>,_std::allocator<Arc>_> arcs;
  vector<int,_std::allocator<int>_> *labels_local;
  Arcflow *this_local;
  
  arcs._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)labels;
  std::set<Arc,_std::less<Arc>,_std::allocator<Arc>_>::set
            ((set<Arc,_std::less<Arc>,_std::allocator<Arc>_> *)&__range1);
  __end1 = std::vector<Arc,_std::allocator<Arc>_>::begin(&this->A);
  a = (Arc *)std::vector<Arc,_std::allocator<Arc>_>::end(&this->A);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_> *)
                               &a);
    if (!bVar1) break;
    _v = __gnu_cxx::__normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_>::operator*
                   (&__end1);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        arcs._M_t._M_impl.super__Rb_tree_header._M_node_count,(long)_v->u);
    local_6c = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        arcs._M_t._M_impl.super__Rb_tree_header._M_node_count,(long)_v->v);
    local_70 = *pvVar2;
    if (local_6c != local_70) {
      Arc::Arc(&local_7c,&local_6c,&local_70,_v->label);
      std::set<Arc,_std::less<Arc>,_std::allocator<Arc>_>::insert
                ((set<Arc,_std::less<Arc>,_std::allocator<Arc>_> *)&__range1,&local_7c);
    }
    __gnu_cxx::__normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_>::operator++
              (&__end1);
  }
  __first = std::set<Arc,_std::less<Arc>,_std::allocator<Arc>_>::begin
                      ((set<Arc,_std::less<Arc>,_std::allocator<Arc>_> *)&__range1);
  __last = std::set<Arc,_std::less<Arc>,_std::allocator<Arc>_>::end
                     ((set<Arc,_std::less<Arc>,_std::allocator<Arc>_> *)&__range1);
  std::vector<Arc,std::allocator<Arc>>::assign<std::_Rb_tree_const_iterator<Arc>,void>
            ((vector<Arc,std::allocator<Arc>> *)&this->A,
             (_Rb_tree_const_iterator<Arc>)__first._M_node,
             (_Rb_tree_const_iterator<Arc>)__last._M_node);
  std::set<Arc,_std::less<Arc>,_std::allocator<Arc>_>::~set
            ((set<Arc,_std::less<Arc>,_std::allocator<Arc>_> *)&__range1);
  return;
}

Assistant:

void Arcflow::relabel_graph(const std::vector<int> &labels) {
	std::set<Arc> arcs;
	for (const Arc &a : A) {
		int u = labels[a.u];
		int v = labels[a.v];
		if (u != v) {
			arcs.insert(Arc(u, v, a.label));
		}
	}
	A.assign(all(arcs));
}